

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

SQObject __thiscall SQCompiler::Expect(SQCompiler *this,SQInteger tok)

{
  long in_RSI;
  SQCompiler *in_RDI;
  SQObject SVar1;
  SQObjectPtr ret;
  SQChar *etypename;
  SQCompiler *in_stack_ffffffffffffff30;
  SQObject *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  SQChar *in_stack_ffffffffffffff70;
  SQObjectValue in_stack_ffffffffffffff78;
  SQInteger in_stack_ffffffffffffff80;
  SQObjectValue in_stack_ffffffffffffff88;
  SQObjectPtr local_40;
  char *local_30;
  long local_28;
  ulong local_18;
  SQObjectValue SStack_10;
  
  local_28 = in_RSI;
  if ((in_RDI->_token != in_RSI) && ((in_RDI->_token != 0x136 || (in_RSI != 0x102)))) {
    if (0xff < in_RSI) {
      switch(in_RSI) {
      case 0x102:
        local_30 = "IDENTIFIER";
        break;
      case 0x103:
        local_30 = "STRING_LITERAL";
        break;
      case 0x104:
        local_30 = "INTEGER";
        break;
      case 0x105:
        local_30 = "FLOAT";
        break;
      default:
        local_30 = SQLexer::Tok2Str((SQLexer *)in_stack_ffffffffffffff88.pTable,
                                    in_stack_ffffffffffffff80);
      }
      Error(in_RDI,"expected \'%s\'",local_30);
    }
    Error(in_RDI,"expected \'%c\'",local_28);
  }
  ::SQObjectPtr::SQObjectPtr(&local_40);
  switch(local_28) {
  case 0x102:
    SQFuncState::CreateString
              ((SQFuncState *)in_stack_ffffffffffffff78.pTable,in_stack_ffffffffffffff70,
               (SQInteger)in_RDI);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    break;
  case 0x103:
    in_stack_ffffffffffffff30 = (SQCompiler *)(in_RDI->_lex)._svalue;
    sqvector<char>::size(&(in_RDI->_lex)._longstr);
    SVar1 = SQFuncState::CreateString
                      ((SQFuncState *)in_stack_ffffffffffffff78.pTable,in_stack_ffffffffffffff70,
                       (SQInteger)in_RDI);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(SVar1._type,in_stack_ffffffffffffff40),
               (SQObject *)SVar1._unVal.pTable);
    break;
  case 0x104:
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff80,(in_RDI->_lex)._nvalue);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (SQObjectPtr *)in_stack_ffffffffffffff38);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff30);
    break;
  case 0x105:
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff70,(in_RDI->_lex)._fvalue);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (SQObjectPtr *)in_stack_ffffffffffffff38);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff30);
  }
  Lex(in_stack_ffffffffffffff30);
  local_18 = local_40.super_SQObject._0_8_;
  SStack_10 = local_40.super_SQObject._unVal;
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff30);
  SVar1._0_8_ = local_18 & 0xffffffff;
  SVar1._unVal.pTable = SStack_10.pTable;
  return SVar1;
}

Assistant:

SQObject Expect(SQInteger tok)
    {

        if(_token != tok) {
            if(_token == TK_CONSTRUCTOR && tok == TK_IDENTIFIER) {
                //do nothing
            }
            else {
                const SQChar *etypename;
                if(tok > 255) {
                    switch(tok)
                    {
                    case TK_IDENTIFIER:
                        etypename = _SC("IDENTIFIER");
                        break;
                    case TK_STRING_LITERAL:
                        etypename = _SC("STRING_LITERAL");
                        break;
                    case TK_INTEGER:
                        etypename = _SC("INTEGER");
                        break;
                    case TK_FLOAT:
                        etypename = _SC("FLOAT");
                        break;
                    default:
                        etypename = _lex.Tok2Str(tok);
                    }
                    Error(_SC("expected '%s'"), etypename);
                }
                Error(_SC("expected '%c'"), tok);
            }
        }
        SQObjectPtr ret;
        switch(tok)
        {
        case TK_IDENTIFIER:
            ret = _fs->CreateString(_lex._svalue);
            break;
        case TK_STRING_LITERAL:
            ret = _fs->CreateString(_lex._svalue,_lex._longstr.size()-1);
            break;
        case TK_INTEGER:
            ret = SQObjectPtr(_lex._nvalue);
            break;
        case TK_FLOAT:
            ret = SQObjectPtr(_lex._fvalue);
            break;
        }
        Lex();
        return ret;
    }